

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaCuFunc.cpp
# Opt level: O1

void __thiscall NaCustomFunc::Function(NaCustomFunc *this,NaReal *x,NaReal *y)

{
  NaExternFunc *pNVar1;
  
  pNVar1 = this->exfunc;
  if (pNVar1 != (NaExternFunc *)0x0) {
    (*(pNVar1->super_NaUnit).super_NaLogging._vptr_NaLogging[6])(pNVar1,x,y);
    return;
  }
  NaPrintLog("Dummy Function(): external function is not linked!\n");
  if (x != (NaReal *)0x0 && y != (NaReal *)0x0) {
    *y = *x;
  }
  return;
}

Assistant:

void
NaCustomFunc::Function (NaReal* x, NaReal* y)
{
  if(NULL == exfunc){
    NaPrintLog("Dummy Function(): external function is not linked!\n");
    if(NULL != y && NULL != x)
      *y  = *x;
    return;
  }

  exfunc->Function(x, y);
}